

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O1

int __thiscall crnlib::crn_block_compressor::init(crn_block_compressor *this,EVP_PKEY_CTX *ctx)

{
  pixel_format pVar1;
  int iVar2;
  crn_format fmt;
  pixel_format pVar3;
  EVP_PKEY_CTX *ctx_00;
  
  memcpy(&this->m_comp_params,ctx,0x378);
  dxt_image::pack_params::init(&this->m_pack_params,ctx);
  fmt = crnd::crnd_get_fundamental_dxt_format(*(crn_format *)(ctx + 0x18));
  pVar1 = pixel_format_helpers::convert_crn_format_to_pixel_format(fmt);
  pVar3 = PIXEL_FMT_DXT1A;
  if (((byte)ctx[0x20] & 0x80) == 0) {
    pVar3 = pVar1;
  }
  if (pVar1 != PIXEL_FMT_DXT1) {
    pVar3 = pVar1;
  }
  if ((int)pVar3 < 0x41315844) {
    if ((int)pVar3 < 0x32495441) {
      if ((int)pVar3 < 0x31545844) {
        if (pVar3 == PIXEL_FMT_ETC1) {
          ctx_00 = (EVP_PKEY_CTX *)0x7;
          goto LAB_0014c42c;
        }
        if (pVar3 == PIXEL_FMT_DXT5A) {
          ctx_00 = (EVP_PKEY_CTX *)0x4;
          goto LAB_0014c42c;
        }
      }
      else {
        ctx_00 = (EVP_PKEY_CTX *)0x0;
        if (pVar3 == PIXEL_FMT_DXT1) goto LAB_0014c42c;
        if (pVar3 == PIXEL_FMT_ETC2) {
          ctx_00 = (EVP_PKEY_CTX *)0x8;
          goto LAB_0014c42c;
        }
      }
    }
    else if ((int)pVar3 < 0x33545844) {
      if (pVar3 == PIXEL_FMT_3DC) {
        ctx_00 = (EVP_PKEY_CTX *)0x6;
        goto LAB_0014c42c;
      }
      if (pVar3 == PIXEL_FMT_DXT2) goto LAB_0014c409;
    }
    else {
      if (pVar3 == PIXEL_FMT_DXT3) {
LAB_0014c409:
        ctx_00 = (EVP_PKEY_CTX *)0x2;
        goto LAB_0014c42c;
      }
      if ((pVar3 == PIXEL_FMT_DXT4) || (pVar3 == PIXEL_FMT_DXT5)) goto LAB_0014c427;
    }
  }
  else if ((int)pVar3 < 0x52784778) {
    if ((int)pVar3 < 0x52424741) {
      if (pVar3 == PIXEL_FMT_DXT1A) {
        ctx_00 = (EVP_PKEY_CTX *)0x1;
        goto LAB_0014c42c;
      }
      if (pVar3 == PIXEL_FMT_ETC2A) {
        ctx_00 = (EVP_PKEY_CTX *)0x9;
        goto LAB_0014c42c;
      }
    }
    else if ((pVar3 == PIXEL_FMT_DXT5_AGBR) || (pVar3 == PIXEL_FMT_DXT5_xGBR)) goto LAB_0014c427;
  }
  else if ((int)pVar3 < 0x53413245) {
    if (pVar3 == PIXEL_FMT_DXT5_xGxR) {
LAB_0014c427:
      ctx_00 = (EVP_PKEY_CTX *)0x3;
      goto LAB_0014c42c;
    }
    if (pVar3 == PIXEL_FMT_ETC1S) {
      ctx_00 = (EVP_PKEY_CTX *)0xa;
      goto LAB_0014c42c;
    }
  }
  else {
    if (pVar3 == PIXEL_FMT_ETC2AS) {
      ctx_00 = (EVP_PKEY_CTX *)0xb;
      goto LAB_0014c42c;
    }
    if (pVar3 == PIXEL_FMT_DXN) {
      ctx_00 = (EVP_PKEY_CTX *)0x5;
      goto LAB_0014c42c;
    }
    if (pVar3 == PIXEL_FMT_DXT5_CCxY) goto LAB_0014c427;
  }
  ctx_00 = (EVP_PKEY_CTX *)0xffffffff;
LAB_0014c42c:
  iVar2 = dxt_image::init(&this->m_image,ctx_00);
  return iVar2;
}

Assistant:

bool init(const crn_comp_params& params)
        {
            m_comp_params = params;

            m_pack_params.init(params);

            crn_format basic_crn_fmt = crnd::crnd_get_fundamental_dxt_format(params.m_format);
            pixel_format basic_pixel_fmt = pixel_format_helpers::convert_crn_format_to_pixel_format(basic_crn_fmt);

            if ((params.get_flag(cCRNCompFlagDXT1AForTransparency)) && (basic_pixel_fmt == PIXEL_FMT_DXT1))
            {
                basic_pixel_fmt = PIXEL_FMT_DXT1A;
            }

            if (!m_image.init(pixel_format_helpers::get_dxt_format(basic_pixel_fmt), cDXTBlockSize, cDXTBlockSize, false))
            {
                return false;
            }

            return true;
        }